

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O2

void __thiscall correctness_shl__Test::TestBody(correctness_shl__Test *this)

{
  bool bVar1;
  char *in_R9;
  AssertHelper AStack_108;
  AssertionResult gtest_ar_;
  big_integer local_f0;
  AssertionResult gtest_ar__1;
  big_integer a;
  big_integer local_48;
  
  big_integer::big_integer(&a,0x17);
  big_integer::big_integer(&local_48,&a);
  ::operator<<(&local_f0,&local_48,5);
  big_integer::big_integer((big_integer *)&gtest_ar__1,0x2e0);
  gtest_ar_.success_ = operator==(&local_f0,(big_integer *)&gtest_ar__1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  big_integer::~big_integer((big_integer *)&gtest_ar__1);
  big_integer::~big_integer(&local_f0);
  big_integer::~big_integer(&local_48);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_f0,(internal *)&gtest_ar_,(AssertionResult *)"(a << 5) == 23 * 32",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
               ,0x196,(char *)local_f0._0_8_);
    testing::internal::AssertHelper::operator=(&AStack_108,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper(&AStack_108);
    std::__cxx11::string::~string((string *)&local_f0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  big_integer::operator<<=(&a,5);
  big_integer::big_integer(&local_f0,0x2e0);
  bVar1 = operator==(&a,&local_f0);
  gtest_ar__1.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  gtest_ar__1.success_ = bVar1;
  big_integer::~big_integer(&local_f0);
  if (!bVar1) {
    testing::Message::Message((Message *)&gtest_ar_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_f0,(internal *)&gtest_ar__1,(AssertionResult *)"a == 23 * 32",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
               ,0x199,(char *)local_f0._0_8_);
    testing::internal::AssertHelper::operator=(&AStack_108,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&AStack_108);
    std::__cxx11::string::~string((string *)&local_f0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__1.message_);
  big_integer::~big_integer(&a);
  return;
}

Assistant:

TEST(correctness, shl_)
{
    big_integer a = 23;

    EXPECT_TRUE((a << 5) == 23 * 32);

    a <<= 5;
    EXPECT_TRUE(a == 23 * 32);
}